

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrModeTBB(MCInst *MI,uint Op,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  MCOperand *op_00;
  MCInst *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  MCOperand *MO2;
  MCOperand *MO1;
  char *in_stack_ffffffffffffffb8;
  cs_struct *s;
  MCInst *in_stack_ffffffffffffffc0;
  SStream *OS;
  MCInst *h;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  op_00 = MCInst_getOperand(in_RDI,in_ESI + 1);
  SStream_concat0((SStream *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  set_mem_access(in_stack_ffffffffffffffc0,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  OS = (SStream *)in_RDI->csh;
  h = in_RDX;
  MCOperand_getReg(op);
  printRegName((cs_struct *)h,OS,(uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    uVar1 = MCOperand_getReg(op);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar1;
  }
  SStream_concat0((SStream *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  s = in_RDI->csh;
  MCOperand_getReg(op_00);
  printRegName((cs_struct *)h,OS,(uint)((ulong)in_RDX >> 0x20));
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    uVar1 = MCOperand_getReg(op_00);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x49) = uVar1;
  }
  SStream_concat0((SStream *)in_RDX,(char *)s);
  set_mem_access(in_RDX,SUB81((ulong)s >> 0x38,0));
  return;
}

Assistant:

static void printAddrModeTBB(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op+1);
	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	SStream_concat0(O, ", ");
	printRegName(MI->csh, O, MCOperand_getReg(MO2));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = MCOperand_getReg(MO2);
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}